

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap_iterator.hpp
# Opt level: O0

void __thiscall
burst::
bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::bitap_iterator(bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,searcher_type *bitap,text_range_type *text)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  corpus_begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  corpus_end;
  char *pcVar1;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  iVar2;
  text_range_type *text_local;
  searcher_type *bitap_local;
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>::bitap
            (&this->m_bitap,bitap);
  this->m_hint = 0;
  corpus_begin._M_current = (char *)std::__cxx11::string::begin();
  corpus_end._M_current = (char *)std::__cxx11::string::end();
  iVar2 = (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
           )algorithm::bitap<char,unsigned_short,std::array<unsigned_short,256ul>>::
            find_first<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((bitap<char,unsigned_short,std::array<unsigned_short,256ul>> *)this,
                       corpus_begin,corpus_end,&this->m_hint);
  (this->m_match).
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
       = iVar2;
  pcVar1 = (char *)std::__cxx11::string::end();
  (this->m_text_end)._M_current = pcVar1;
  return;
}

Assistant:

bitap_iterator (searcher_type bitap, const text_range_type & text):
            m_bitap(std::move(bitap)),
            m_hint(0b0),
            m_match(m_bitap.find_first(text.begin(), text.end(), m_hint)),
            m_text_end(text.end())
        {
        }